

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPML_CCA_Marshal(TPML_CCA *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPML_CCA *source_local;
  
  UVar1 = UINT32_Marshal(&source->count,buffer,size);
  UVar2 = TPMA_CC_Array_Marshal(source->commandAttributes,buffer,size,source->count);
  return UVar1 + UVar2;
}

Assistant:

UINT16
TPML_CCA_Marshal(TPML_CCA *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->count), buffer, size));
    result = (UINT16)(result + TPMA_CC_Array_Marshal((TPMA_CC *)(source->commandAttributes), buffer, size, (INT32)(source->count)));
    return result;
}